

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMus<(moira::Mode)10,_2> wrapper)

{
  uint uVar1;
  int iVar2;
  Int i;
  char *pcVar3;
  Int i_00;
  bool bVar4;
  char *pcVar5;
  uint uVar6;
  char cVar7;
  
  uVar1 = (wrapper.ea)->ext1;
  cVar7 = (char)uVar1;
  if ((uVar1 >> 8 & 1) == 0) {
    pcVar5 = this->ptr;
    this->ptr = pcVar5 + 1;
    *pcVar5 = '(';
    if (cVar7 != '\0') {
      operator<<(this,(Int)(int)cVar7);
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = ',';
    }
    operator<<(this);
    pcVar5 = this->ptr;
    this->ptr = pcVar5 + 1;
    *pcVar5 = ',';
    operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
    pcVar5 = "$%x.l";
    if ((uVar1 >> 0xb & 1) == 0) {
      pcVar5 = "$%x.w";
    }
    pcVar5 = pcVar5 + 3;
    cVar7 = *pcVar5;
    while (cVar7 != '\0') {
      pcVar5 = pcVar5 + 1;
      pcVar3 = this->ptr;
      this->ptr = pcVar3 + 1;
      *pcVar3 = cVar7;
      cVar7 = *pcVar5;
    }
    operator<<(this,(Scale)(uVar1 >> 9 & 3));
  }
  else {
    iVar2 = (wrapper.ea)->ext2;
    i.raw = (wrapper.ea)->ext3;
    pcVar5 = this->ptr;
    this->ptr = pcVar5 + 1;
    if ((uVar1 & 0xe4) == 0xc4 || (uVar1 & 0xe2) == 0xc0) {
      *pcVar5 = '0';
      return this;
    }
    uVar6 = uVar1 & 7;
    *pcVar5 = '(';
    if (4 < uVar6 || uVar6 - 1 < 3) {
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = '[';
    }
    if (iVar2 == 0) {
      bVar4 = false;
    }
    else {
      i_00.raw = (int)(short)iVar2;
      if ((~uVar1 & 0x30) == 0) {
        i_00.raw = iVar2;
      }
      operator<<(this,i_00);
      bVar4 = true;
    }
    if (-1 < cVar7) {
      if (bVar4) {
        pcVar5 = this->ptr;
        this->ptr = pcVar5 + 1;
        *pcVar5 = ',';
      }
      operator<<(this);
      bVar4 = true;
    }
    if (4 < uVar6) {
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = ']';
      bVar4 = true;
    }
    if ((uVar1 & 0x40) == 0) {
      if (bVar4) {
        pcVar5 = this->ptr;
        this->ptr = pcVar5 + 1;
        *pcVar5 = ',';
      }
      operator<<(this,(Rn)(uVar1 >> 0xc & 0xf));
      pcVar5 = "$%x.l";
      if ((uVar1 >> 0xb & 1) == 0) {
        pcVar5 = "$%x.w";
      }
      pcVar5 = pcVar5 + 3;
      cVar7 = *pcVar5;
      while (cVar7 != '\0') {
        pcVar5 = pcVar5 + 1;
        pcVar3 = this->ptr;
        this->ptr = pcVar3 + 1;
        *pcVar3 = cVar7;
        cVar7 = *pcVar5;
      }
      operator<<(this,(Scale)(uVar1 >> 9 & 3));
      bVar4 = true;
    }
    if (uVar6 - 1 < 3) {
      pcVar5 = this->ptr;
      this->ptr = pcVar5 + 1;
      *pcVar5 = ']';
      bVar4 = true;
    }
    if (i.raw != 0) {
      if (bVar4) {
        pcVar5 = this->ptr;
        this->ptr = pcVar5 + 1;
        *pcVar5 = ',';
      }
      operator<<(this,i);
    }
  }
  pcVar5 = this->ptr;
  this->ptr = pcVar5 + 1;
  *pcVar5 = ')';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMus<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(";
        if (disp) *this << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg};
        *this << (lw ? ".l" : ".w");
        *this << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        bool preindex = (iis > 0 && iis < 4);
        bool postindex = (iis > 4);
        bool effectiveZero = (ea.ext1 & 0xe4) == 0xC4 || (ea.ext1 & 0xe2) == 0xC0;
        bool comma = false;

        if (effectiveZero) {

            *this << "0";
            return *this;
        }

        *this << "(";

        if (preindex || postindex) {

            *this << "[";
        }
        if (base) {

            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
            comma = true;
        }
        if (!bs) {

            if (comma) *this << ",";
            M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
            comma = true;
        }
        if (postindex) {

            *this << "]";
            comma = true;
        }
        if (!is) {

            if (comma) *this << ",";
            *this << Rn{reg};
            *this << (lw ? ".l" : ".w");
            *this << Scale{scale};
            comma = true;
        }
        if (preindex) {

            *this << "]";
            comma = true;
        }
        if(outer)
        {
            if (comma) *this << ",";
            *this << Int(outer);
        }

        *this << ")";
    }

    return *this;
}